

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalizers.cpp
# Opt level: O2

bool user_select_objs_replace_placeholder_proc
               (Am_Object *ph,Am_Value *new_value,Am_Object *sel_widget)

{
  bool bVar1;
  Am_Value *pAVar2;
  ostream *poVar3;
  Am_Object local_40;
  Am_Value ok;
  
  pAVar2 = Am_Object::Get(ph,Am_PLACEHOLDER_INITIALIZED,0);
  bVar1 = Am_Value::Valid(pAVar2);
  if (bVar1) {
    pAVar2 = Am_Object::Get(ph,0x169,0);
    Am_Value::operator=(new_value,pAVar2);
    bVar1 = true;
  }
  else {
    ok.type = 0;
    ok.value.wrapper_value = (Am_Wrapper *)0x0;
    Am_Object::Set(ph,Am_PLACEHOLDER_INITIALIZED,true,0);
    Am_Object::Am_Object(&local_40,&am_askselectobj);
    Am_Pop_Up_Window_And_Wait(&local_40,&ok,false);
    Am_Object::~Am_Object(&local_40);
    bVar1 = Am_Value::Valid(&ok);
    if (bVar1) {
      pAVar2 = Am_Object::Get(sel_widget,0x169,0);
      Am_Value::operator=(new_value,pAVar2);
      if (am_sdebug == true) {
        poVar3 = std::operator<<((ostream *)&std::cout,"for placeholder ");
        poVar3 = operator<<(poVar3,ph);
        poVar3 = std::operator<<(poVar3," setting value to ");
        poVar3 = operator<<(poVar3,new_value);
        std::endl<char,std::char_traits<char>>(poVar3);
        std::ostream::flush();
      }
      Am_Object::Set(ph,0x169,new_value,0);
    }
    Am_Value::~Am_Value(&ok);
  }
  return bVar1;
}

Assistant:

Am_Define_Method(Am_Placeholder_Replace_Method, bool,
                 user_select_objs_replace_placeholder,
                 (Am_Object & ph, Am_Value &new_value, Am_Object &sel_widget))
{
  if (ph.Get(Am_PLACEHOLDER_INITIALIZED).Valid()) {
    new_value = ph.Get(Am_VALUE);
    return true;
  } else {
    Am_Value ok;
    ph.Set(Am_PLACEHOLDER_INITIALIZED, true);
    Am_Pop_Up_Window_And_Wait(am_askselectobj, ok, false);
    if (ok.Valid()) {
      new_value = sel_widget.Get(Am_VALUE);
      if (am_sdebug)
        std::cout << "for placeholder " << ph << " setting value to "
                  << new_value << std::endl
                  << std::flush;
      ph.Set(Am_VALUE, new_value);
      return true;
    } else
      return false;
  }
}